

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMfs2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  char *pcVar8;
  uint local_c0;
  int nFramesAdd;
  int fUseAllFfs;
  int fIndDCs;
  int c;
  Sfm_Par_t *pPars;
  Sfm_Par_t Pars;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._112_8_ = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  bVar2 = false;
  local_c0 = 0;
  Sfm_ParSetDefault((Sfm_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_00268f32:
  iVar3 = Extra_UtilGetopt(argc,argv,"WFDMLCZNIdaeijvwh");
  if (iVar3 == -1) {
    if (Pars._112_8_ == 0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar3 = Abc_NtkIsLogic((Abc_Ntk_t *)Pars._112_8_);
    if (iVar3 == 0) {
      Abc_Print(-1,"This command can only be applied to a logic network.\n");
      return 1;
    }
    if (bVar1) {
      if (bVar2) {
        pAbc->nIndFrames = 1;
        Vec_IntFreeP(&pAbc->vIndFlops);
        iVar3 = Abc_NtkLatchNum((Abc_Ntk_t *)Pars._112_8_);
        pVVar7 = Vec_IntAlloc(iVar3);
        pAbc->vIndFlops = pVVar7;
        pVVar7 = pAbc->vIndFlops;
        iVar3 = Abc_NtkLatchNum((Abc_Ntk_t *)Pars._112_8_);
        Vec_IntFill(pVVar7,iVar3,1);
      }
      if (pAbc->nIndFrames < 1) {
        Abc_Print(-1,"The number of k-inductive frames is not specified.\n");
        return 0;
      }
      if (pAbc->vIndFlops == (Vec_Int_t *)0x0) {
        Abc_Print(-1,"The set of k-inductive flops is not specified.\n");
        return 0;
      }
      iVar3 = Vec_IntSize(pAbc->vIndFlops);
      iVar4 = Abc_NtkLatchNum((Abc_Ntk_t *)Pars._112_8_);
      if (iVar3 != iVar4) {
        uVar5 = Vec_IntSize(pAbc->vIndFlops);
        uVar6 = Abc_NtkLatchNum((Abc_Ntk_t *)Pars._112_8_);
        Abc_Print(-1,"The saved flop count (%d) does not match that of the current network (%d).\n",
                  (ulong)uVar5,(ulong)uVar6);
        return 0;
      }
      iVar3 = Abc_NtkMfsAfterICheck
                        ((Abc_Ntk_t *)Pars._112_8_,pAbc->nIndFrames,local_c0,pAbc->vIndFlops,
                         (Sfm_Par_t *)&pPars);
      if (iVar3 == 0) {
        Abc_Print(-1,"Resynthesis has failed.\n");
        return 1;
      }
      if (bVar2) {
        pAbc->nIndFrames = 0;
        Vec_IntFreeP(&pAbc->vIndFlops);
      }
    }
    else {
      iVar3 = Abc_NtkPerformMfs((Abc_Ntk_t *)Pars._112_8_,(Sfm_Par_t *)&pPars);
      if (iVar3 == 0) {
        Abc_Print(-1,"Resynthesis has failed.\n");
        return 1;
      }
    }
    return 0;
  }
  switch(iVar3) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nWinSizeMax = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nWinSizeMax;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nTfiLevMax = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nTfiLevMax;
    break;
  default:
    goto LAB_0026968c;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nTfoLevMax = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nTfoLevMax;
    break;
  case 0x49:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    local_c0 = atoi(argv[globalUtilOptind]);
    uVar5 = local_c0;
    break;
  case 0x4c:
    if (globalUtilOptind < argc) goto LAB_0026917e;
    Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
    goto LAB_0026968c;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nMffcMax = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nMffcMax;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nGrowthLevel = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nGrowthLevel;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    pPars._0_4_ = atoi(argv[globalUtilOptind]);
    uVar5 = (uint)pPars;
    break;
  case 0x5a:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-Z\" should be followed by an integer.\n");
      goto LAB_0026968c;
    }
    Pars.nNodesMax = atoi(argv[globalUtilOptind]);
    uVar5 = Pars.nNodesMax;
    break;
  case 0x61:
    Pars.DelAreaRatio = Pars.DelAreaRatio ^ 1;
    goto LAB_00268f32;
  case 100:
    Pars.DeltaCrit = Pars.DeltaCrit ^ 1;
    goto LAB_00268f32;
  case 0x65:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_00268f32;
  case 0x68:
    goto LAB_0026968c;
  case 0x69:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00268f32;
  case 0x6a:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_00268f32;
  case 0x76:
    Pars.fLibVerbose = Pars.fLibVerbose ^ 1;
    goto LAB_00268f32;
  case 0x77:
    Pars.fDelayVerbose = Pars.fDelayVerbose ^ 1;
    goto LAB_00268f32;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar5 < 0) {
LAB_0026968c:
    Abc_Print(-2,"usage: mfs2 [-WFDMLCZNI <num>] [-daeijvwh]\n");
    Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
    Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
              (ulong)(uint)pPars);
    Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
              (ulong)(uint)Pars.nTfoLevMax);
    Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
              (ulong)(uint)Pars.nTfiLevMax);
    Abc_Print(-2,
              "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nMffcMax);
    Abc_Print(-2,
              "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
              ,(ulong)(uint)Pars.nDecMax);
    Abc_Print(-2,
              "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nWinSizeMax);
    Abc_Print(-2,
              "\t-Z <num> : treat the first <num> logic nodes as fixed (0 = none) [default = %d]\n",
              (ulong)(uint)Pars.nNodesMax);
    Abc_Print(-2,"\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",
              (ulong)(uint)Pars.nGrowthLevel);
    pcVar8 = "no";
    if (Pars.DeltaCrit != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar8);
    pcVar8 = "area+edges";
    if (Pars.DelAreaRatio != 0) {
      pcVar8 = "area";
    }
    Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fArea != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (bVar1) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-i       : toggle using inductive don\'t-cares [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (bVar2) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-j       : toggle using all flops when \"-i\" is enabled [default = %s]\n",
              pcVar8);
    Abc_Print(-2,"\t-I       : the number of additional frames inserted [default = %d]\n",
              (ulong)local_c0);
    pcVar8 = "no";
    if (Pars.fLibVerbose != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar8);
    pcVar8 = "no";
    if (Pars.fDelayVerbose != 0) {
      pcVar8 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",pcVar8
             );
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_00268f32;
LAB_0026917e:
  Pars.nDecMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((Pars.nDecMax < -1000000000) || (1000000000 < Pars.nDecMax)) goto LAB_0026968c;
  goto LAB_00268f32;
}

Assistant:

int Abc_CommandMfs2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkPerformMfs( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars );
    extern int Abc_NtkMfsAfterICheck( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, Sfm_Par_t * pPars );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Sfm_Par_t Pars, * pPars = &Pars;
    int c, fIndDCs = 0, fUseAllFfs = 0, nFramesAdd = 0;
    // set defaults
    Sfm_ParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCZNIdaeijvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < -ABC_INFINITY || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'Z':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Z\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFirstFixed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFirstFixed < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodesMax < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesAdd < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 'i':
            fIndDCs ^= 1;
            break;
        case 'j':
            fUseAllFfs ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( fIndDCs )
    {
        if ( fUseAllFfs )
        {
            pAbc->nIndFrames = 1;
            Vec_IntFreeP( &pAbc->vIndFlops );
            pAbc->vIndFlops = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
            Vec_IntFill( pAbc->vIndFlops, Abc_NtkLatchNum(pNtk), 1 );
        }
        if ( pAbc->nIndFrames <= 0 )
        {
            Abc_Print( -1, "The number of k-inductive frames is not specified.\n" );
            return 0;
        }
        if ( pAbc->vIndFlops == NULL )
        {
            Abc_Print( -1, "The set of k-inductive flops is not specified.\n" );
            return 0;
        }
        if ( Vec_IntSize(pAbc->vIndFlops) != Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "The saved flop count (%d) does not match that of the current network (%d).\n",
                Vec_IntSize(pAbc->vIndFlops), Abc_NtkLatchNum(pNtk) );
            return 0;
        }
        // modify the current network
        if ( !Abc_NtkMfsAfterICheck( pNtk, pAbc->nIndFrames, nFramesAdd, pAbc->vIndFlops, pPars ) )
        {
            Abc_Print( -1, "Resynthesis has failed.\n" );
            return 1;
        }
        if ( fUseAllFfs )
        {
            pAbc->nIndFrames = 0;
            Vec_IntFreeP( &pAbc->vIndFlops );
        }
    }
    else
    {
        // modify the current network
        if ( !Abc_NtkPerformMfs( pNtk, pPars ) )
        {
            Abc_Print( -1, "Resynthesis has failed.\n" );
            return 1;
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: mfs2 [-WFDMLCZNI <num>] [-daeijvwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",                   pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n",    pPars->nWinSizeMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-Z <num> : treat the first <num> logic nodes as fixed (0 = none) [default = %d]\n",       pPars->nFirstFixed );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",                    pPars->nNodesMax );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n",                        pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n",                        pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n",                           pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggle using inductive don't-cares [default = %s]\n",                          fIndDCs? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggle using all flops when \"-i\" is enabled [default = %s]\n",               fUseAllFfs? "yes": "no" );
    Abc_Print( -2, "\t-I       : the number of additional frames inserted [default = %d]\n",                    nFramesAdd );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}